

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O2

float loss_cs(warm_cb *data,v_array<COST_SENSITIVE::wclass> *costs,uint32_t final_prediction)

{
  wclass *pwVar1;
  float fVar2;
  
  pwVar1 = costs->_begin;
  do {
    if (pwVar1 == costs->_end) {
      fVar2 = 0.0;
LAB_001ec5f6:
      return (data->loss1 - data->loss0) * fVar2 + data->loss0;
    }
    if (pwVar1->class_index == final_prediction) {
      fVar2 = pwVar1->x;
      goto LAB_001ec5f6;
    }
    pwVar1 = pwVar1 + 1;
  } while( true );
}

Assistant:

float loss_cs(warm_cb& data, v_array<COST_SENSITIVE::wclass>& costs, uint32_t final_prediction)
{
  float cost = 0.;
  for (auto wc : costs)
  { if (wc.class_index == final_prediction)
    { cost = wc.x;
      break;
    }
  }
  return data.loss0 + (data.loss1 - data.loss0) * cost;
}